

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_1D_mri.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined4 uVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  FILE *pFVar8;
  FILE *__stream;
  FILE *__stream_00;
  undefined8 *puVar9;
  long lVar10;
  char *pcVar11;
  double *pdVar12;
  UserData udata;
  double dVar13;
  double extraout_XMM0_Qa;
  undefined1 auVar14 [16];
  double dVar15;
  SUNContext ctx;
  MRIStepInnerStepper inner_stepper;
  sunrealtype t;
  void *inner_arkode_mem;
  void *arkode_mem;
  long ncfn;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nffi;
  long nfse;
  long netf;
  long nstf_a;
  long nstf;
  long nsts;
  long nffe;
  long nfsi;
  undefined8 local_150;
  long local_148;
  double local_140;
  long local_138;
  long local_130;
  long local_128;
  undefined8 local_120;
  undefined1 local_118 [16];
  long local_108;
  undefined8 local_100;
  long local_f8;
  long local_f0;
  double local_e8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  double local_58;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  
  local_f0 = 0;
  local_f8 = 0;
  local_120 = 0;
  uVar2 = SUNContext_Create(0,&local_150);
  if ((int)uVar2 < 0) {
    pcVar11 = "SUNContext_Create";
    goto LAB_00103202;
  }
  plVar4 = (long *)malloc(0x30);
  if (plVar4 == (long *)0x0) {
    main_cold_13();
    return 1;
  }
  *plVar4 = 200;
  plVar4[3] = 0x400c000000000000;
  plVar4[4] = 0x3fd0000000000000;
  plVar4[5] = 0x3eb0c6f7a0b5ed8d;
  plVar4[1] = 0x3f747ae147ae147b;
  plVar4[2] = 0x3ff0000000000000;
  puts("\n1D Advection-Reaction example problem:");
  printf("    N = %li,  NEQ = %li\n",*plVar4,600);
  printf("    problem parameters:  a = %g,  b = %g,  ep = %g\n",plVar4[2],(int)plVar4[3],plVar4[5]);
  printf("    advection coefficient:  c = %g\n",plVar4[4]);
  printf("    reltol = %.1e,  abstol = %.1e\n\n",0x3eb0c6f7a0b5ed8d,0xd9d7bdbb);
  local_148 = N_VNew_Serial(600,local_150);
  if (local_148 == 0) {
    main_cold_12();
    return 1;
  }
  lVar7 = *plVar4;
  local_118._8_8_ = 0;
  local_118._0_8_ = plVar4[2];
  local_140 = (double)plVar4[3];
  local_e8 = (double)plVar4[1];
  lVar5 = N_VGetArrayPointer(local_148);
  if (0 < lVar7) {
    local_118._8_4_ = SUB84(local_140 / (double)local_118._0_8_,0);
    local_118._12_4_ = (int)((ulong)(local_140 / (double)local_118._0_8_) >> 0x20);
    pdVar12 = (double *)(lVar5 + 0x10);
    lVar5 = 0;
    do {
      dVar13 = (double)lVar5 * local_e8 + -0.5;
      dVar13 = exp((-dVar13 * dVar13) / 0.1);
      dVar13 = dVar13 * 0.1;
      pdVar12[-2] = dVar13 + (double)local_118._0_8_;
      pdVar12[-1] = dVar13 + (double)local_118._8_8_;
      *pdVar12 = local_140 + dVar13;
      lVar5 = lVar5 + 1;
      pdVar12 = pdVar12 + 3;
    } while (lVar7 != lVar5);
  }
  lVar7 = local_148;
  local_128 = N_VClone(local_148);
  if (local_128 == 0) {
    main_cold_11();
    return 1;
  }
  local_130 = N_VClone(lVar7);
  if (local_130 == 0) {
    main_cold_10();
    return 1;
  }
  local_138 = N_VClone(lVar7);
  lVar5 = local_128;
  if (local_138 == 0) {
    main_cold_9();
    return 1;
  }
  N_VConst(0,local_128);
  lVar6 = N_VGetArrayPointer(lVar5);
  lVar5 = local_130;
  if (lVar6 == 0) {
    main_cold_8();
    return 1;
  }
  lVar10 = 0;
  do {
    *(undefined8 *)(lVar6 + lVar10) = 0x3ff0000000000000;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x12c0);
  N_VConst(0,local_130);
  lVar6 = N_VGetArrayPointer(lVar5);
  lVar5 = local_138;
  if (lVar6 == 0) {
    main_cold_7();
    return 1;
  }
  lVar10 = 8;
  do {
    *(undefined8 *)(lVar6 + lVar10) = 0x3ff0000000000000;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x12c8);
  N_VConst(0,local_138);
  lVar5 = N_VGetArrayPointer(lVar5);
  if (lVar5 == 0) {
    main_cold_6();
    return 1;
  }
  lVar6 = 0x10;
  do {
    *(undefined8 *)(lVar5 + lVar6) = 0x3ff0000000000000;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x12d0);
  lVar5 = SUNBandMatrix(600,4,4,local_150);
  if (lVar5 == 0) {
    main_cold_5();
    return 1;
  }
  lVar6 = SUNLinSol_Band(lVar7,lVar5,local_150);
  if (lVar6 == 0) {
    main_cold_4();
    return 1;
  }
  lVar10 = ARKStepCreate(0,0,ff,lVar7,local_150);
  local_f8 = lVar10;
  if (lVar10 == 0) {
    main_cold_3();
    return 1;
  }
  uVar2 = ARKodeSetUserData(lVar10,plVar4);
  if (-1 < (int)uVar2) {
    uVar2 = ARKStepSetTableNum(lVar10,0x68,0xffffffff);
    if ((int)uVar2 < 0) {
      pcVar11 = "ARKStepSetTableNum";
      goto LAB_00103202;
    }
    uVar2 = ARKodeSStolerances(0x3eb0c6f7a0b5ed8d,0xd9d7bdbb,lVar10);
    if ((int)uVar2 < 0) {
      pcVar11 = "ARKodeSStolerances";
      goto LAB_00103202;
    }
    uVar2 = ARKodeSetLinearSolver(lVar10,lVar6,lVar5);
    if ((int)uVar2 < 0) {
      pcVar11 = "ARKodeSetLinearSolver";
      goto LAB_00103202;
    }
    uVar2 = ARKodeSetJacFn(lVar10,Jf);
    if ((int)uVar2 < 0) {
      pcVar11 = "ARKodeSetJacFn";
      goto LAB_00103202;
    }
    uVar2 = ARKStepCreateMRIStepInnerStepper(lVar10,&local_120);
    if ((int)uVar2 < 0) {
      pcVar11 = "ARKStepCreateMRIStepInnerStepper";
      goto LAB_00103202;
    }
    lVar7 = MRIStepCreate(0,fs,0,lVar7,local_120,local_150);
    local_f0 = lVar7;
    if (lVar7 == 0) {
      main_cold_2();
      return 1;
    }
    uVar2 = ARKodeSetUserData(lVar7,plVar4);
    if (-1 < (int)uVar2) {
      uVar2 = ARKodeSetFixedStep(0x3f847ae147ae147b,lVar7);
      if (-1 < (int)uVar2) {
        local_108 = lVar7;
        local_c8 = lVar10;
        local_c0 = lVar6;
        local_b8 = lVar5;
        pFVar8 = fopen("mesh.txt","w");
        lVar7 = 0;
        do {
          fprintf(pFVar8,"  %.16e\n",(double)lVar7 * (double)plVar4[1]);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0xc9);
        fclose(pFVar8);
        pFVar8 = fopen("u.txt","w");
        __stream = fopen("v.txt","w");
        __stream_00 = fopen("w.txt","w");
        puVar9 = (undefined8 *)N_VGetArrayPointer(local_148);
        if (puVar9 == (undefined8 *)0x0) {
          main_cold_1();
          return 1;
        }
        lVar7 = 0;
        local_d0 = plVar4;
        do {
          fprintf(pFVar8," %.16e",*(undefined8 *)((long)puVar9 + lVar7));
          lVar7 = lVar7 + 0x18;
        } while (lVar7 != 0x12c0);
        fprintf(pFVar8," %.16e",*puVar9);
        fputc(10,pFVar8);
        lVar7 = 8;
        do {
          fprintf(__stream," %.16e",*(undefined8 *)((long)puVar9 + lVar7));
          lVar7 = lVar7 + 0x18;
        } while (lVar7 != 0x12c8);
        fprintf(__stream," %.16e",puVar9[1]);
        fputc(10,__stream);
        lVar7 = 0x10;
        do {
          fprintf(__stream_00," %.16e",*(undefined8 *)((long)puVar9 + lVar7));
          lVar7 = lVar7 + 0x18;
        } while (lVar7 != 0x12d0);
        fprintf(__stream_00," %.16e",puVar9[2]);
        fputc(10,__stream_00);
        local_100 = 0;
        puts("        t      ||u||_rms   ||v||_rms   ||w||_rms");
        puts("   ----------------------------------------------");
        dVar13 = 0.1;
        uVar2 = 0;
        do {
          auVar1 = local_118;
          lVar7 = local_148;
          local_118._4_4_ = 0;
          local_118._0_4_ = uVar2;
          local_118._8_8_ = auVar1._8_8_;
          local_140 = dVar13;
          uVar2 = ARKodeEvolve(local_108,local_148,&local_100,1);
          if ((int)uVar2 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeEvolve",
                    (ulong)uVar2);
            break;
          }
          dVar13 = (double)N_VWL2Norm(lVar7,local_128);
          local_e8 = (dVar13 * dVar13) / 200.0;
          local_58 = (double)N_VWL2Norm(lVar7,local_130);
          uVar3 = N_VWL2Norm(lVar7,local_138);
          auVar14._0_8_ = extraout_XMM0_Qa * extraout_XMM0_Qa;
          auVar14._8_8_ = local_58 * local_58;
          auVar14 = divpd(auVar14,_DAT_00104040);
          lVar7 = -(ulong)(0.0 < auVar14._8_8_);
          auVar1._8_4_ = (int)lVar7;
          auVar1._0_8_ = -(ulong)(0.0 < auVar14._0_8_);
          auVar1._12_4_ = (int)((ulong)lVar7 >> 0x20);
          uVar2 = movmskpd(uVar3,auVar1);
          if ((uVar2 & 2) == 0) {
            dVar13 = 0.0;
          }
          else {
            dVar13 = SQRT(auVar14._8_8_);
          }
          if ((uVar2 & 1) == 0) {
            dVar15 = 0.0;
          }
          else {
            dVar15 = SQRT(auVar14._0_8_);
          }
          printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",local_100,
                 -(uint)(0.0 < local_e8) & SUB84(SQRT(local_e8),0),dVar13,dVar15);
          lVar7 = 0;
          do {
            fprintf(pFVar8," %.16e",*(undefined8 *)((long)puVar9 + lVar7));
            lVar7 = lVar7 + 0x18;
          } while (lVar7 != 0x12c0);
          fprintf(pFVar8," %.16e",*puVar9);
          fputc(10,pFVar8);
          lVar7 = 8;
          do {
            fprintf(__stream," %.16e",*(undefined8 *)((long)puVar9 + lVar7));
            lVar7 = lVar7 + 0x18;
          } while (lVar7 != 0x12c8);
          fprintf(__stream," %.16e",puVar9[1]);
          fputc(10,__stream);
          lVar7 = 0x10;
          do {
            fprintf(__stream_00," %.16e",*(undefined8 *)((long)puVar9 + lVar7));
            lVar7 = lVar7 + 0x18;
          } while (lVar7 != 0x12d0);
          fprintf(__stream_00," %.16e",puVar9[2]);
          fputc(10,__stream_00);
          dVar13 = 10.0;
          if (local_140 + 0.1 <= 10.0) {
            dVar13 = local_140 + 0.1;
          }
          uVar2 = local_118._0_4_ + 1;
        } while (uVar2 != 100);
        puts("   ----------------------------------------------");
        fclose(pFVar8);
        fclose(__stream);
        fclose(__stream_00);
        lVar7 = local_108;
        uVar2 = ARKodeGetNumSteps(local_108,&local_60);
        if ((int)uVar2 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeGetNumSteps",
                  (ulong)uVar2);
        }
        uVar2 = MRIStepGetNumRhsEvals(lVar7,&local_80,local_38);
        lVar5 = local_c0;
        lVar7 = local_c8;
        plVar4 = local_d0;
        if ((int)uVar2 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","MRIStepGetNumRhsEvals"
                  ,(ulong)uVar2);
        }
        uVar2 = ARKodeGetNumSteps(lVar7,&local_68);
        if ((int)uVar2 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeGetNumSteps",
                  (ulong)uVar2);
        }
        uVar2 = ARKodeGetNumStepAttempts(lVar7,&local_70);
        if ((int)uVar2 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                  "ARKodeGetNumStepAttempts",(ulong)uVar2);
        }
        uVar2 = ARKStepGetNumRhsEvals(lVar7,local_40,&local_88);
        if ((int)uVar2 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKStepGetNumRhsEvals"
                  ,(ulong)uVar2);
        }
        uVar2 = ARKodeGetNumLinSolvSetups(lVar7,&local_90);
        if ((int)uVar2 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                  "ARKodeGetNumLinSolvSetups",(ulong)uVar2);
        }
        uVar2 = ARKodeGetNumErrTestFails(lVar7,&local_78);
        if ((int)uVar2 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                  "ARKodeGetNumErrTestFails",(ulong)uVar2);
        }
        uVar2 = ARKodeGetNumNonlinSolvIters(lVar7,&local_a8);
        if ((int)uVar2 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                  "ARKodeGetNumNonlinSolvIters",(ulong)uVar2);
        }
        uVar2 = ARKodeGetNumNonlinSolvConvFails(lVar7,&local_b0);
        if ((int)uVar2 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                  "ARKodeGetNumNonlinSolvConvFails",(ulong)uVar2);
        }
        uVar2 = ARKodeGetNumJacEvals(lVar7,&local_98);
        if ((int)uVar2 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeGetNumJacEvals",
                  (ulong)uVar2);
        }
        uVar2 = ARKodeGetNumLinRhsEvals(lVar7,&local_a0);
        if ((int)uVar2 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                  "ARKodeGetNumLinRhsEvals",(ulong)uVar2);
        }
        puts("\nFinal Solver Statistics:");
        printf("   Slow Steps: nsts = %li\n",local_60);
        printf("   Fast Steps: nstf = %li (attempted = %li)\n",local_68,local_70);
        printf("   Total RHS evals:  Fs = %li,  Ff = %li\n",local_80,local_88);
        printf("   Total number of fast error test failures = %li\n",local_78);
        printf("   Total linear solver setups = %li\n",local_90);
        printf("   Total RHS evals for setting up the linear system = %li\n",local_a0);
        printf("   Total number of Jacobian evaluations = %li\n",local_98);
        printf("   Total number of Newton iterations = %li\n",local_a8);
        printf("   Total number of nonlinear solver convergence failures = %li\n",local_b0);
        free(plVar4);
        ARKodeFree(&local_f8);
        MRIStepInnerStepper_Free(&local_120);
        ARKodeFree(&local_f0);
        SUNLinSolFree(lVar5);
        SUNMatDestroy(local_b8);
        N_VDestroy(local_148);
        N_VDestroy(local_128);
        N_VDestroy(local_130);
        N_VDestroy(local_138);
        SUNContext_Free(&local_150);
        return 0;
      }
      pcVar11 = "ARKodeSetFixedStep";
      goto LAB_00103202;
    }
  }
  pcVar11 = "ARKodeSetUserData";
LAB_00103202:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar11,(ulong)uVar2);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);  /* initial time                    */
  sunrealtype Tf     = SUN_RCONST(10.0); /* final time                      */
  int Nt             = 100;              /* total number of output times    */
  int Nvar           = 3;                /* number of solution fields       */
  sunindextype N     = 200;              /* spatial mesh size (N intervals) */
  sunrealtype a      = SUN_RCONST(1.0);  /* problem parameters              */
  sunrealtype b      = SUN_RCONST(3.5);
  sunrealtype c      = SUN_RCONST(0.25);
  sunrealtype ep     = SUN_RCONST(1.0e-6); /* stiffness parameter */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances          */
  sunrealtype abstol = SUN_RCONST(1.0e-10);

  /* general problem variables */
  sunrealtype hs;                           /* slow step size                 */
  int retval;                               /* reusable return flag           */
  N_Vector y                        = NULL; /* empty solution vector          */
  N_Vector umask                    = NULL; /* empty mask vectors             */
  N_Vector vmask                    = NULL;
  N_Vector wmask                    = NULL;
  SUNMatrix A                       = NULL; /* empty matrix for linear solver */
  SUNLinearSolver LS                = NULL; /* empty linear solver structure  */
  void* arkode_mem                  = NULL; /* empty ARKode memory structure  */
  void* inner_arkode_mem            = NULL; /* empty ARKode memory structure  */
  MRIStepInnerStepper inner_stepper = NULL; /* inner stepper                  */
  sunrealtype t, dTout, tout;               /* current/output time data       */
  sunrealtype u, v, w;                      /* temp data values               */
  FILE *FID, *UFID, *VFID, *WFID;           /* output file pointers           */
  int iout;                                 /* output counter                 */
  long int nsts, nstf, nstf_a, netf;        /* step stats                     */
  long int nfse, nfsi, nffe, nffi;          /* RHS stats                      */
  long int nsetups, nje, nfeLS;             /* linear solver stats            */
  long int nni, ncfn;                       /* nonlinear solver stats         */
  sunindextype NEQ;                         /* number of equations            */
  sunindextype i;                           /* counter                        */
  UserData udata    = NULL;                 /* user data pointer              */
  sunrealtype* data = NULL;                 /* array for vector data          */

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* allocate udata structure */
  udata = (UserData)malloc(sizeof(*udata));
  if (check_retval((void*)udata, "malloc", 2)) { return 1; }

  /* store the inputs in the UserData structure */
  udata->N  = N;
  udata->a  = a;
  udata->b  = b;
  udata->c  = c;
  udata->ep = ep;
  udata->dx = SUN_RCONST(1.0) / N; /* periodic BC, divide by N not N-1 */

  /* set total allocated vector length */
  NEQ = Nvar * udata->N;

  /* set the slow step size */
  hs = SUN_RCONST(0.5) * (udata->dx / SUNRabs(c));

  /* Initial problem output */
  printf("\n1D Advection-Reaction example problem:\n");
  printf("    N = %li,  NEQ = %li\n", (long int)udata->N, (long int)NEQ);
  printf("    problem parameters:  a = %" GSYM ",  b = %" GSYM ",  ep = %" GSYM
         "\n",
         udata->a, udata->b, udata->ep);
  printf("    advection coefficient:  c = %" GSYM "\n", udata->c);
  printf("    reltol = %.1" ESYM ",  abstol = %.1" ESYM "\n\n", reltol, abstol);

  /* Create solution vector */
  y = N_VNew_Serial(NEQ, ctx); /* Create vector for solution */
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }

  /* Set initial condition */
  retval = SetIC(y, udata);
  if (check_retval(&retval, "SetIC", 1)) { return 1; }

  /* Create vector masks */
  umask = N_VClone(y);
  if (check_retval((void*)umask, "N_VClone", 0)) { return 1; }

  vmask = N_VClone(y);
  if (check_retval((void*)vmask, "N_VClone", 0)) { return 1; }

  wmask = N_VClone(y);
  if (check_retval((void*)wmask, "N_VClone", 0)) { return 1; }

  /* Set mask array values for each solution component */
  N_VConst(0.0, umask);
  data = N_VGetArrayPointer(umask);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return 1; }
  for (i = 0; i < N; i++) { data[IDX(i, 0)] = SUN_RCONST(1.0); }

  N_VConst(0.0, vmask);
  data = N_VGetArrayPointer(vmask);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return 1; }
  for (i = 0; i < N; i++) { data[IDX(i, 1)] = SUN_RCONST(1.0); }

  N_VConst(0.0, wmask);
  data = N_VGetArrayPointer(wmask);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return 1; }
  for (i = 0; i < N; i++) { data[IDX(i, 2)] = SUN_RCONST(1.0); }

  /*
   * Create the fast integrator and set options
   */

  /* Initialize matrix and linear solver data structures */
  A = SUNBandMatrix(NEQ, 4, 4, ctx);
  if (check_retval((void*)A, "SUNBandMatrix", 0)) { return 1; }

  LS = SUNLinSol_Band(y, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return 1; }

  /* Initialize the fast integrator. Specify the implicit fast right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the inital time T0, and the
     initial dependent variable vector y. */
  inner_arkode_mem = ARKStepCreate(NULL, ff, T0, y, ctx);
  if (check_retval((void*)inner_arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Attach user data to fast integrator */
  retval = ARKodeSetUserData(inner_arkode_mem, (void*)udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the fast method */
  retval = ARKStepSetTableNum(inner_arkode_mem, ARKODE_ARK324L2SA_DIRK_4_2_3, -1);
  if (check_retval(&retval, "ARKStepSetTableNum", 1)) { return 1; }

  /* Specify fast tolerances */
  retval = ARKodeSStolerances(inner_arkode_mem, reltol, abstol);
  if (check_retval(&retval, "ARKodeSStolerances", 1)) { return 1; }

  /* Attach matrix and linear solver */
  retval = ARKodeSetLinearSolver(inner_arkode_mem, LS, A);
  if (check_retval(&retval, "ARKodeSetLinearSolver", 1)) { return 1; }

  /* Set the Jacobian routine */
  retval = ARKodeSetJacFn(inner_arkode_mem, Jf);
  if (check_retval(&retval, "ARKodeSetJacFn", 1)) { return 1; }

  /* Create inner stepper */
  retval = ARKStepCreateMRIStepInnerStepper(inner_arkode_mem, &inner_stepper);
  if (check_retval(&retval, "ARKStepCreateMRIStepInnerStepper", 1))
  {
    return 1;
  }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the slow integrator. Specify the explicit slow right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the inital time T0, the
     initial dependent variable vector y, and the fast integrator. */
  arkode_mem = MRIStepCreate(fs, NULL, T0, y, inner_stepper, ctx);
  if (check_retval((void*)arkode_mem, "MRIStepCreate", 0)) { return 1; }

  /* Pass udata to user functions */
  retval = ARKodeSetUserData(arkode_mem, (void*)udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the slow step size */
  retval = ARKodeSetFixedStep(arkode_mem, hs);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* output spatial mesh to disk (add extra point for periodic BC) */
  FID = fopen("mesh.txt", "w");
  for (i = 0; i < N + 1; i++)
  {
    fprintf(FID, "  %.16" ESYM "\n", udata->dx * i);
  }
  fclose(FID);

  /* Open output stream for results, access data arrays */
  UFID = fopen("u.txt", "w");
  VFID = fopen("v.txt", "w");
  WFID = fopen("w.txt", "w");

  /* output initial condition to disk (extra output for periodic BC) */
  data = N_VGetArrayPointer(y);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return 1; }

  for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM, data[IDX(i, 0)]); }
  fprintf(UFID, " %.16" ESYM, data[IDX(0, 0)]);
  fprintf(UFID, "\n");

  for (i = 0; i < N; i++) { fprintf(VFID, " %.16" ESYM, data[IDX(i, 1)]); }
  fprintf(VFID, " %.16" ESYM, data[IDX(0, 1)]);
  fprintf(VFID, "\n");

  for (i = 0; i < N; i++) { fprintf(WFID, " %.16" ESYM, data[IDX(i, 2)]); }
  fprintf(WFID, " %.16" ESYM, data[IDX(0, 2)]);
  fprintf(WFID, "\n");

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration,
     then prints results.  Stops when the final time has been reached */
  t     = T0;
  dTout = (Tf - T0) / Nt;
  tout  = T0 + dTout;
  printf("        t      ||u||_rms   ||v||_rms   ||w||_rms\n");
  printf("   ----------------------------------------------\n");
  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }

    /* access/print solution statistics */
    u = N_VWL2Norm(y, umask);
    u = SUNRsqrt(u * u / N);
    v = N_VWL2Norm(y, vmask);
    v = SUNRsqrt(v * v / N);
    w = N_VWL2Norm(y, wmask);
    w = SUNRsqrt(w * w / N);
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
           u, v, w);

    /* output results to disk (extr output for periodic BC) */
    for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM, data[IDX(i, 0)]); }
    fprintf(UFID, " %.16" ESYM, data[IDX(0, 0)]);
    fprintf(UFID, "\n");

    for (i = 0; i < N; i++) { fprintf(VFID, " %.16" ESYM, data[IDX(i, 1)]); }
    fprintf(VFID, " %.16" ESYM, data[IDX(0, 1)]);
    fprintf(VFID, "\n");

    for (i = 0; i < N; i++) { fprintf(WFID, " %.16" ESYM, data[IDX(i, 2)]); }
    fprintf(WFID, " %.16" ESYM, data[IDX(0, 2)]);
    fprintf(WFID, "\n");

    /* successful solve: update output time */
    tout += dTout;
    tout = (tout > Tf) ? Tf : tout;
  }
  printf("   ----------------------------------------------\n");
  fclose(UFID);
  fclose(VFID);
  fclose(WFID);

  /* Get some slow integrator statistics */
  retval = ARKodeGetNumSteps(arkode_mem, &nsts);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = MRIStepGetNumRhsEvals(arkode_mem, &nfse, &nfsi);
  check_retval(&retval, "MRIStepGetNumRhsEvals", 1);

  /* Get some fast integrator statistics */
  retval = ARKodeGetNumSteps(inner_arkode_mem, &nstf);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumStepAttempts(inner_arkode_mem, &nstf_a);
  check_retval(&retval, "ARKodeGetNumStepAttempts", 1);
  retval = ARKStepGetNumRhsEvals(inner_arkode_mem, &nffe, &nffi);
  check_retval(&retval, "ARKStepGetNumRhsEvals", 1);
  retval = ARKodeGetNumLinSolvSetups(inner_arkode_mem, &nsetups);
  check_retval(&retval, "ARKodeGetNumLinSolvSetups", 1);
  retval = ARKodeGetNumErrTestFails(inner_arkode_mem, &netf);
  check_retval(&retval, "ARKodeGetNumErrTestFails", 1);
  retval = ARKodeGetNumNonlinSolvIters(inner_arkode_mem, &nni);
  check_retval(&retval, "ARKodeGetNumNonlinSolvIters", 1);
  retval = ARKodeGetNumNonlinSolvConvFails(inner_arkode_mem, &ncfn);
  check_retval(&retval, "ARKodeGetNumNonlinSolvConvFails", 1);
  retval = ARKodeGetNumJacEvals(inner_arkode_mem, &nje);
  check_retval(&retval, "ARKodeGetNumJacEvals", 1);
  retval = ARKodeGetNumLinRhsEvals(inner_arkode_mem, &nfeLS);
  check_retval(&retval, "ARKodeGetNumLinRhsEvals", 1);

  /* Print some final statistics */
  printf("\nFinal Solver Statistics:\n");
  printf("   Slow Steps: nsts = %li\n", nsts);
  printf("   Fast Steps: nstf = %li (attempted = %li)\n", nstf, nstf_a);
  printf("   Total RHS evals:  Fs = %li,  Ff = %li\n", nfse, nffi);
  printf("   Total number of fast error test failures = %li\n", netf);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of nonlinear solver convergence failures = %li\n",
         ncfn);

  /* Clean up and return with successful completion */
  free(udata);                              /* Free user data         */
  ARKodeFree(&inner_arkode_mem);            /* Free integrator memory */
  MRIStepInnerStepper_Free(&inner_stepper); /* Free inner stepper */
  ARKodeFree(&arkode_mem);                  /* Free integrator memory */
  SUNLinSolFree(LS);                        /* Free linear solver     */
  SUNMatDestroy(A);                         /* Free matrix            */
  N_VDestroy(y);                            /* Free vectors           */
  N_VDestroy(umask);
  N_VDestroy(vmask);
  N_VDestroy(wmask);
  SUNContext_Free(&ctx); /* Free context */

  return 0;
}